

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboRenderTest.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::FboCases::StencilClearsTest::StencilClearsTest
          (StencilClearsTest *this,Context *context,FboConfig *config)

{
  string local_40;
  
  FboConfig::getName_abi_cxx11_(&local_40,config);
  FboRenderCase::FboRenderCase
            (&this->super_FboRenderCase,context,local_40._M_dataplus._M_p,"Stencil clears",config);
  std::__cxx11::string::~string((string *)&local_40);
  (this->super_FboRenderCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_00c25f80;
  return;
}

Assistant:

StencilClearsTest::StencilClearsTest (Context& context, const FboConfig& config)
	: FboRenderCase	(context, config.getName().c_str(), "Stencil clears", config)
{
}